

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser2_syntax.c
# Opt level: O2

RK_S32 h265d_syntax_fill_slice(void *ctx,RK_S32 input_index)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  undefined2 *puVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  undefined2 *puVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  int local_bc;
  RK_S32 _out;
  undefined2 *local_b0;
  ulong local_a8;
  undefined2 *local_a0;
  long local_98;
  MppBuffer streambuf;
  BitReadCtx_t gb_cxt;
  
  lVar2 = *ctx;
  lVar11 = *(long *)(lVar2 + 0x25730);
  streambuf = (MppBuffer)0x0;
  if (input_index == -1) {
    puVar5 = (undefined2 *)mpp_packet_get_data(*(MppPacket *)(lVar2 + 0x25728));
    sVar6 = mpp_packet_get_size(*(MppPacket *)(lVar2 + 0x25728));
    uVar8 = 0;
    uVar10 = (ulong)*(uint *)(lVar2 + 0x1150);
    if ((int)*(uint *)(lVar2 + 0x1150) < 1) {
      uVar10 = uVar8;
    }
    iVar14 = 0;
    for (; uVar10 * 0x18 - uVar8 != 0; uVar8 = uVar8 + 0x18) {
      iVar14 = iVar14 + *(int *)(*(long *)(lVar2 + 0x1148) + 0xc + uVar8) + 4;
    }
    uVar15 = iVar14 + 0xfU & 0xfffffff0;
    if ((uint)sVar6 < uVar15 + 0x40) {
      mpp_osal_free("h265d_syntax_fill_slice",puVar5);
      sVar6 = (size_t)(int)(uVar15 + 0x2c3f & 0xfffffc00);
      puVar5 = (undefined2 *)mpp_osal_malloc("h265d_syntax_fill_slice",sVar6);
      mpp_packet_set_data(*(MppPacket *)(lVar2 + 0x25728),puVar5);
      mpp_packet_set_size(*(MppPacket *)(lVar2 + 0x25728),sVar6);
    }
    puVar12 = (undefined2 *)0x0;
  }
  else {
    mpp_buf_slot_get_prop(*(MppBufSlots *)(lVar2 + 0x25718),input_index,SLOT_BUFFER,&streambuf);
    puVar5 = (undefined2 *)mpp_buffer_get_ptr_with_caller(streambuf,"h265d_syntax_fill_slice");
    puVar12 = puVar5;
    if (puVar5 == (undefined2 *)0x0) {
      return -3;
    }
  }
  iVar14 = *(int *)(lVar2 + 0x1150);
  local_98 = lVar11;
  if (*(int *)(lVar11 + 0x1e78) < iVar14) {
    if (*(void **)(lVar11 + 0x1e58) != (void *)0x0) {
      mpp_osal_free("h265d_syntax_fill_slice",*(void **)(lVar11 + 0x1e58));
      iVar14 = *(int *)(lVar2 + 0x1150);
    }
    *(undefined8 *)(lVar11 + 0x1e58) = 0;
    pvVar7 = mpp_osal_malloc("h265d_syntax_fill_slice",(long)iVar14 * 0xc);
    *(void **)(lVar11 + 0x1e58) = pvVar7;
    if (pvVar7 == (void *)0x0) {
      return -0x3ee;
    }
    if (*(void **)(lVar11 + 0x1e70) != (void *)0x0) {
      mpp_osal_free("h265d_syntax_fill_slice",*(void **)(lVar11 + 0x1e70));
    }
    *(undefined8 *)(lVar11 + 0x1e70) = 0;
    pvVar7 = mpp_osal_malloc("h265d_syntax_fill_slice",(long)*(int *)(lVar2 + 0x1150) * 0xc);
    *(void **)(lVar11 + 0x1e70) = pvVar7;
    if (pvVar7 == (void *)0x0) {
      return -0x3ee;
    }
    iVar14 = *(int *)(lVar2 + 0x1150);
    *(int *)(lVar11 + 0x1e78) = iVar14;
  }
  lVar13 = 0;
  lVar11 = 0;
  local_bc = 0;
  local_a8 = 0;
  local_b0 = puVar5;
  local_a0 = puVar12;
  while( true ) {
    if (iVar14 <= lVar11) {
      *(int *)(local_98 + 0x1e54) = local_bc;
      *(int *)(local_98 + 0x1e68) = (int)local_a8;
      if (input_index == -1) {
        *(undefined8 *)(local_98 + 0x1e60) = 0;
        mpp_packet_set_length(*(MppPacket *)(lVar2 + 0x25728),local_a8 & 0xffffffff);
      }
      else {
        *(undefined2 **)(local_98 + 0x1e60) = local_a0;
        mpp_buf_slot_set_flag(*(MppBufSlots *)(lVar2 + 0x25718),input_index,SLOT_CODEC_READY);
        mpp_buf_slot_set_flag(*(MppBufSlots *)(lVar2 + 0x25718),input_index,SLOT_HAL_INPUT);
      }
      return 0;
    }
    mpp_set_bitread_ctx(&gb_cxt,*(RK_U8 **)(*(long *)(lVar2 + 0x1148) + 0x10 + lVar13),
                        *(RK_S32 *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar13));
    mpp_set_bitread_pseudo_code_type(&gb_cxt,PSEUDO_CODE_H264_H265);
    gb_cxt.ret = mpp_read_bits(&gb_cxt,1,&_out);
    if ((gb_cxt.ret != MPP_OK) ||
       (gb_cxt.ret = mpp_read_bits(&gb_cxt,6,&_out), puVar5 = local_b0, gb_cxt.ret != MPP_OK))
    break;
    if ((uint)_out < 0x20) {
      *(undefined1 *)(local_b0 + 1) = 1;
      *local_b0 = 0;
      iVar4 = (int)local_a8;
      memcpy((void *)((long)local_b0 + 3),*(void **)(*(long *)(lVar2 + 0x1148) + 0x10 + lVar13),
             (long)*(int *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar13));
      lVar3 = *(long *)(local_98 + 0x1e58);
      lVar9 = (long)local_bc * 0xc;
      uVar1 = *(undefined4 *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar13);
      *(undefined4 *)(lVar3 + 8 + lVar9) = 0;
      *(int *)(lVar3 + lVar9) = iVar4 + 3;
      *(undefined4 *)(lVar3 + 4 + lVar9) = uVar1;
      lVar3 = *(long *)(local_98 + 0x1e70);
      *(undefined8 *)(lVar3 + lVar9) = 0;
      *(undefined4 *)(lVar3 + 8 + lVar9) = 0;
      iVar14 = *(int *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar13);
      local_b0 = (undefined2 *)((long)puVar5 + (long)iVar14 + 3);
      local_a8 = (ulong)(iVar4 + iVar14 + 3);
      local_bc = local_bc + 1;
    }
    lVar11 = lVar11 + 1;
    iVar14 = *(int *)(lVar2 + 0x1150);
    lVar13 = lVar13 + 0x18;
  }
  return -0x3ec;
}

Assistant:

RK_S32 h265d_syntax_fill_slice(void *ctx, RK_S32 input_index)
{
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    const HEVCContext *h = (const HEVCContext *)h265dctx->priv_data;
    h265d_dxva2_picture_context_t *ctx_pic = (h265d_dxva2_picture_context_t *)h->hal_pic_private;
    MppBuffer streambuf = NULL;
    RK_S32 i, count = 0;
    RK_U32 position = 0;
    RK_U8 *ptr = NULL;
    RK_U8 *current = NULL;
    RK_U32 size = 0, length = 0;
    // mpp_err("input_index = %d",input_index);
    if (-1 != input_index) {
        mpp_buf_slot_get_prop(h->packet_slots, input_index, SLOT_BUFFER, &streambuf);
        current = ptr = (RK_U8 *)mpp_buffer_get_ptr(streambuf);
        if (current == NULL) {
            return MPP_ERR_NULL_PTR;
        }
    } else {
        RK_S32 buff_size = 0;
        current = (RK_U8 *)mpp_packet_get_data(h->input_packet);
        size = (RK_U32)mpp_packet_get_size(h->input_packet);
        for (i = 0; i < h->nb_nals; i++) {
            length += h->nals[i].size + 4;
        }
        length = MPP_ALIGN(length, 16) + 64;
        if (length > size) {
            mpp_free(current);
            buff_size = MPP_ALIGN(length + 10 * 1024, 1024);
            current = mpp_malloc(RK_U8, buff_size);
            mpp_packet_set_data(h->input_packet, (void*)current);
            mpp_packet_set_size(h->input_packet, buff_size);
        }
    }
    if (ctx_pic->max_slice_num < h->nb_nals) {

        MPP_FREE(ctx_pic->slice_short);

        ctx_pic->slice_short = (DXVA_Slice_HEVC_Short *)mpp_malloc(DXVA_Slice_HEVC_Short, h->nb_nals);
        if (!ctx_pic->slice_short)
            return MPP_ERR_NOMEM;

        MPP_FREE(ctx_pic->slice_cut_param);

        ctx_pic->slice_cut_param = (DXVA_Slice_HEVC_Cut_Param *)mpp_malloc(DXVA_Slice_HEVC_Cut_Param, h->nb_nals);
        if (!ctx_pic->slice_cut_param)
            return MPP_ERR_NOMEM;

        ctx_pic->max_slice_num = h->nb_nals;
    }
    for (i = 0; i < h->nb_nals; i++) {
        static const RK_U8 start_code[] = {0, 0, 1 };
        static const RK_U32 start_code_size = sizeof(start_code);
        BitReadCtx_t gb_cxt, *gb;
        RK_S32 value;
        RK_U32 nal_type;

        mpp_set_bitread_ctx(&gb_cxt, (RK_U8 *)h->nals[i].data,
                            h->nals[i].size);
        mpp_set_bitread_pseudo_code_type(&gb_cxt, PSEUDO_CODE_H264_H265);

        gb = &gb_cxt;

        READ_ONEBIT(gb, &value); /*this bit should be zero*/

        READ_BITS(gb, 6, &nal_type);

        if (nal_type >= 32) {
            continue;
        }
        memcpy(current, start_code, start_code_size);
        current += start_code_size;
        position += start_code_size;
        memcpy(current, h->nals[i].data, h->nals[i].size);
        // mpp_log("h->nals[%d].size = %d", i, h->nals[i].size);
        fill_slice_short(&ctx_pic->slice_short[count], position, h->nals[i].size);
        init_slice_cut_param(&ctx_pic->slice_cut_param[count]);
        current += h->nals[i].size;
        position += h->nals[i].size;
        count++;
    }
    ctx_pic->slice_count    = count;
    ctx_pic->bitstream_size = position;
    if (-1 != input_index) {
        ctx_pic->bitstream      = (RK_U8*)ptr;

        mpp_buf_slot_set_flag(h->packet_slots, input_index, SLOT_CODEC_READY);
        mpp_buf_slot_set_flag(h->packet_slots, input_index, SLOT_HAL_INPUT);
    } else {
        ctx_pic->bitstream = NULL;
        mpp_packet_set_length(h->input_packet, position);
    }
    return MPP_OK;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}